

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O0

void ares_free_query(ares_query_t *query)

{
  ares_query_t *query_local;
  
  ares_detach_query(query);
  query->callback = (ares_callback_dnsrec)0x0;
  query->arg = (void *)0x0;
  ares_dns_record_destroy(query->query);
  ares_free(query);
  return;
}

Assistant:

void ares_free_query(ares_query_t *query)
{
  ares_detach_query(query);
  /* Zero out some important stuff, to help catch bugs */
  query->callback = NULL;
  query->arg      = NULL;
  /* Deallocate the memory associated with the query */
  ares_dns_record_destroy(query->query);

  ares_free(query);
}